

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O0

longlong get_int_options_inner(json_t *root,char *option_name,int *result,int should_free)

{
  json_t *json;
  longlong option_value;
  json_t *option_item;
  int should_free_local;
  int *result_local;
  char *option_name_local;
  json_t *root_local;
  
  json = json_object_get(root,option_name);
  if (json == (json_t *)0x0) {
    if (should_free != 0) {
      json_decref(root);
    }
    *result = 0;
    root_local = (json_t *)0xffffffffffffffff;
  }
  else if ((json == (json_t *)0x0) || (json->type != JSON_INTEGER)) {
    *result = -1;
    fprintf(_stderr,"error: option item %s is expected to be an integer\n",option_name);
    if (should_free != 0) {
      json_decref(root);
    }
    root_local = (json_t *)0xffffffffffffffff;
  }
  else {
    root_local = (json_t *)json_integer_value(json);
    *result = 1;
    if (should_free != 0) {
      json_decref(root);
    }
  }
  return (longlong)root_local;
}

Assistant:

static long long get_int_options_inner(json_t * root, const char * option_name, int * result, int should_free)
{
	json_t *option_item;
	long long option_value;

	option_item = json_object_get(root, option_name);
	if (!option_item)
	{
		if (should_free)
			json_decref(root);
		*result = 0;
		return -1;
	}

	if (!json_is_integer(option_item))
	{
		*result = -1;
		fprintf(stderr, "error: option item %s is expected to be an integer\n", option_name);
		if (should_free)
			json_decref(root);
		return -1;
	}

	option_value = json_integer_value(option_item);
	*result = 1;
	if (should_free)
		json_decref(root);
	return option_value;
}